

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSModel.cpp
# Opt level: O0

XSModelGroupDefinition * __thiscall
xercesc_4_0::XSModel::getModelGroupDefinition(XSModel *this,XMLCh *name,XMLCh *compNamespace)

{
  XSNamespaceItem *local_30;
  XSNamespaceItem *namespaceItem;
  XMLCh *compNamespace_local;
  XMLCh *name_local;
  XSModel *this_local;
  
  if (compNamespace == (XMLCh *)0x0) {
    local_30 = getNamespaceItem(this,L"");
  }
  else {
    local_30 = getNamespaceItem(this,compNamespace);
  }
  if (local_30 == (XSNamespaceItem *)0x0) {
    this_local = (XSModel *)0x0;
  }
  else {
    this_local = (XSModel *)XSNamespaceItem::getModelGroupDefinition(local_30,name);
  }
  return (XSModelGroupDefinition *)this_local;
}

Assistant:

XSModelGroupDefinition *XSModel::getModelGroupDefinition(const XMLCh *name
            , const XMLCh *compNamespace)
{
    XSNamespaceItem* namespaceItem;
    if (compNamespace)
        namespaceItem = getNamespaceItem(compNamespace);
    else
        namespaceItem = getNamespaceItem(XMLUni::fgZeroLenString);

    if (namespaceItem)
        return namespaceItem->getModelGroupDefinition(name);

    return 0;
}